

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

string * __thiscall
cmGeneratorTarget::GetInstallNameDirForBuildTree
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config)

{
  cmMakefile *this_00;
  bool bVar1;
  allocator local_79;
  string local_78;
  undefined1 local_55;
  allocator local_41;
  string local_40;
  string *local_20;
  string *config_local;
  cmGeneratorTarget *this_local;
  string *dir;
  
  this_00 = this->Makefile;
  local_20 = config;
  config_local = (string *)this;
  this_local = (cmGeneratorTarget *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"CMAKE_PLATFORM_HAS_INSTALLNAME",&local_41);
  bVar1 = cmMakefile::IsOn(this_00,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  if (bVar1) {
    bVar1 = MacOSXUseInstallNameDir(this);
    if (bVar1) {
      GetInstallNameDirForInstallTree_abi_cxx11_(__return_storage_ptr__,this);
      return __return_storage_ptr__;
    }
    bVar1 = CanGenerateInstallNameDir(this,INSTALL_NAME_FOR_BUILD);
    if (bVar1) {
      local_55 = 0;
      std::__cxx11::string::string((string *)__return_storage_ptr__);
      bVar1 = MacOSXRpathInstallNameDirDefault(this);
      if (bVar1) {
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,"@rpath");
      }
      else {
        GetDirectory(&local_78,this,local_20,RuntimeBinaryArtifact);
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_78);
        std::__cxx11::string::~string((string *)&local_78);
      }
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"/");
      return __return_storage_ptr__;
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_79);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetInstallNameDirForBuildTree(
  const std::string& config) const
{
  if (this->Makefile->IsOn("CMAKE_PLATFORM_HAS_INSTALLNAME")) {

    // If building directly for installation then the build tree install_name
    // is the same as the install tree.
    if (this->MacOSXUseInstallNameDir()) {
      return this->GetInstallNameDirForInstallTree();
    }

    // Use the build tree directory for the target.
    if (this->CanGenerateInstallNameDir(INSTALL_NAME_FOR_BUILD)) {
      std::string dir;
      if (this->MacOSXRpathInstallNameDirDefault()) {
        dir = "@rpath";
      } else {
        dir = this->GetDirectory(config);
      }
      dir += "/";
      return dir;
    }
  }
  return "";
}